

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

int infer_skip(bitstream *str,h264_slice *slice,h264_macroblock *mb)

{
  uint32_t ival;
  int iVar1;
  uint32_t ival_00;
  int local_34;
  int i;
  int val;
  uint32_t skip_type;
  h264_macroblock *mb_local;
  h264_slice *slice_local;
  bitstream *str_local;
  
  ival = 0x20;
  if (slice->slice_type == 1) {
    ival = 0x38;
  }
  if (slice->mbaff_frame_flag == 0) {
    iVar1 = vs_infer(str,&slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag,
                     slice->field_pic_flag);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else if ((slice->curr_mb_addr & 1) != 0) {
    iVar1 = h264_is_skip_mb_type(slice->mbs[slice->curr_mb_addr & 0xfffffffe].mb_type);
    if (iVar1 != 0) {
      ival_00 = inferred_mb_field_decoding_flag(slice);
      iVar1 = vs_infer(str,&mb[-1].mb_field_decoding_flag,ival_00);
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar1 = vs_infer(str,&mb->mb_field_decoding_flag,mb[-1].mb_field_decoding_flag);
    if (iVar1 != 0) {
      return 1;
    }
  }
  iVar1 = vs_infer(str,&mb->mb_type,ival);
  if (iVar1 == 0) {
    iVar1 = vs_infers(str,&mb->mb_qp_delta,0);
    if (iVar1 == 0) {
      iVar1 = vs_infer(str,&mb->transform_size_8x8_flag,0);
      if (iVar1 == 0) {
        iVar1 = vs_infer(str,&mb->coded_block_pattern,0);
        if (iVar1 == 0) {
          iVar1 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
          if (iVar1 == 0) {
            iVar1 = infer_intra(str,mb,0);
            if (iVar1 == 0) {
              iVar1 = infer_intra(str,mb,1);
              if (iVar1 == 0) {
                for (local_34 = 0; local_34 < 0x11; local_34 = local_34 + 1) {
                  mb->coded_block_flag[0][local_34] = 0;
                  mb->coded_block_flag[1][local_34] = 0;
                  mb->coded_block_flag[2][local_34] = 0;
                }
                for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
                  mb->total_coeff[0][local_34] = 0;
                  mb->total_coeff[1][local_34] = 0;
                  *(int *)((long)(mb->coded_block_flag + -1) + ((long)local_34 + 1) * 4) = 0;
                }
                str_local._4_4_ = 0;
              }
              else {
                str_local._4_4_ = 1;
              }
            }
            else {
              str_local._4_4_ = 1;
            }
          }
          else {
            str_local._4_4_ = 1;
          }
        }
        else {
          str_local._4_4_ = 1;
        }
      }
      else {
        str_local._4_4_ = 1;
      }
    }
    else {
      str_local._4_4_ = 1;
    }
  }
  else {
    str_local._4_4_ = 1;
  }
  return str_local._4_4_;
}

Assistant:

static int infer_skip(struct bitstream *str, struct h264_slice *slice, struct h264_macroblock *mb) {
	uint32_t skip_type = (slice->slice_type == H264_SLICE_TYPE_B ? H264_MB_TYPE_B_SKIP : H264_MB_TYPE_P_SKIP);
	if (slice->mbaff_frame_flag) {
		if (slice->curr_mb_addr & 1) {
			if (h264_is_skip_mb_type(slice->mbs[slice->curr_mb_addr & ~1].mb_type)) {
				int val = inferred_mb_field_decoding_flag(slice);
				if (vs_infer(str, &mb[-1].mb_field_decoding_flag, val)) return 1;
			}
			if (vs_infer(str, &mb->mb_field_decoding_flag, mb[-1].mb_field_decoding_flag)) return 1;
		}
	} else {
		if (vs_infer(str, &slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag, slice->field_pic_flag)) return 1;

	}
	if (vs_infer(str, &mb->mb_type, skip_type)) return 1;
	if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
	if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
	if (vs_infer(str, &mb->coded_block_pattern, 0)) return 1;
	if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
	if (infer_intra(str, mb, 0)) return 1;
	if (infer_intra(str, mb, 1)) return 1;
	int i;
	for (i = 0; i < 17; i++) {
		mb->coded_block_flag[0][i] = 0;
		mb->coded_block_flag[1][i] = 0;
		mb->coded_block_flag[2][i] = 0;
	}
	for (i = 0; i < 16; i++) {
		mb->total_coeff[0][i] = 0;
		mb->total_coeff[1][i] = 0;
		mb->total_coeff[2][i] = 0;
	}
	return 0;
}